

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_PageHandle.cc
# Opt level: O0

void * __thiscall MyDB_PageHandleBase::getBytes(MyDB_PageHandleBase *this)

{
  MyDB_LRU *pMVar1;
  MyDB_PageBase *this_00;
  long lVar2;
  bool bVar3;
  reference ppvVar4;
  shared_ptr<MyDB_Table> local_98;
  pair<std::shared_ptr<MyDB_Table>,_long> local_88;
  pair<std::shared_ptr<MyDB_Table>,_long> local_70;
  pair<std::shared_ptr<MyDB_Table>,_long> local_48;
  undefined1 local_30 [8];
  pair<std::shared_ptr<MyDB_Table>,_long> curId;
  void *spareAddr;
  MyDB_PageHandleBase *this_local;
  
  std::pair<std::shared_ptr<MyDB_Table>,_long>::pair
            ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_30,&this->pagePtr->pageId);
  if (this->pagePtr->addr == (void *)0x0) {
    bVar3 = std::queue<void_*,_std::deque<void_*,_std::allocator<void_*>_>_>::empty
                      (&this->bufferManager->availPageQueue);
    if (bVar3) {
      pMVar1 = this->bufferManager->LRU;
      std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_70,&this->pagePtr->pageId);
      curId.second = (long)MyDB_LRU::evictAndReplace(pMVar1,&local_70,this->pagePtr);
      std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_70);
    }
    else {
      pMVar1 = this->bufferManager->LRU;
      std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_88,&this->pagePtr->pageId);
      MyDB_LRU::add(pMVar1,&local_88,this->pagePtr);
      std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_88);
      ppvVar4 = std::queue<void_*,_std::deque<void_*,_std::allocator<void_*>_>_>::front
                          (&this->bufferManager->availPageQueue);
      curId.second = (long)*ppvVar4;
      std::queue<void_*,_std::deque<void_*,_std::allocator<void_*>_>_>::pop
                (&this->bufferManager->availPageQueue);
    }
    this->pagePtr->addr = (void *)curId.second;
    this_00 = this->pagePtr;
    std::shared_ptr<MyDB_Table>::shared_ptr(&local_98,&(this_00->pageId).first);
    MyDB_PageBase::readFromDisk
              (this_00,&local_98,(this->pagePtr->pageId).second,this->pagePtr->addr);
    std::shared_ptr<MyDB_Table>::~shared_ptr(&local_98);
  }
  else {
    pMVar1 = this->bufferManager->LRU;
    std::pair<std::shared_ptr<MyDB_Table>,_long>::pair(&local_48,&this->pagePtr->pageId);
    MyDB_LRU::adjust(pMVar1,&local_48);
    std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair(&local_48);
    curId.second = (long)this->pagePtr->addr;
  }
  lVar2 = curId.second;
  std::pair<std::shared_ptr<MyDB_Table>,_long>::~pair
            ((pair<std::shared_ptr<MyDB_Table>,_long> *)local_30);
  return (void *)lVar2;
}

Assistant:

void *MyDB_PageHandleBase :: getBytes () {
	//store the spare address in the buffer that we will return
	void* spareAddr;
	pair<MyDB_TablePtr, long> curId = this->pagePtr->pageId;

	//map<pair<MyDB_TablePtr, long>, MyDB_Page>::iterator it_pageMap = this->bufferManager->pageMap.find(curId);
	//If find this page in buffer
	if (this->pagePtr->addr != nullptr) {
		this -> bufferManager -> LRU -> adjust(this -> pagePtr -> pageId);
		spareAddr = this->pagePtr->addr;

	}

	//If this page is in the disk and we need to read from disk and put it in the buffer
	else {
		//If there is no empty space in the buffer
		if (this->bufferManager->availPageQueue.empty()) {
			spareAddr = this -> bufferManager -> LRU -> evictAndReplace(this -> pagePtr -> pageId, this -> pagePtr);
		}
		else {
			this -> bufferManager -> LRU -> add(this -> pagePtr -> pageId, this -> pagePtr);
			spareAddr = this -> bufferManager -> availPageQueue.front();
			this -> bufferManager -> availPageQueue.pop();
		}
		this -> pagePtr -> addr = spareAddr;
		this -> pagePtr -> readFromDisk(this -> pagePtr -> pageId.first, this -> pagePtr -> pageId.second, this -> pagePtr ->addr);
	}

	return spareAddr;
}